

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPSocket.h
# Opt level: O0

void __thiscall uWS::HTTPSocket<false>::Data::Data(Data *this,SocketData *socketData)

{
  void *in_RSI;
  void *in_RDI;
  
  memcpy(in_RDI,in_RSI,0x40);
  std::__cxx11::string::string((string *)((long)in_RDI + 0x40));
  std::__cxx11::string::string((string *)((long)in_RDI + 0x60));
  std::__cxx11::string::string((string *)((long)in_RDI + 0x80));
  return;
}

Assistant:

Data(uS::SocketData *socketData) : uS::SocketData(*socketData) {}